

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O1

SortNode * __thiscall GLDrawList::SortSpriteList(GLDrawList *this,SortNode *head)

{
  SortNode **ppSVar1;
  ulong uVar2;
  ulong uVar3;
  SortNode *pSVar4;
  
  if (SortSpriteList(SortNode*)::sortspritelist == '\0') {
    SortSpriteList();
  }
  pSVar4 = head->parent;
  if (SortSpriteList::sortspritelist.Count != 0) {
    SortSpriteList::sortspritelist.Count = 0;
  }
  if (head != (SortNode *)0x0) {
    do {
      TArray<SortNode_*,_SortNode_*>::Grow(&SortSpriteList::sortspritelist,1);
      SortSpriteList::sortspritelist.Array[SortSpriteList::sortspritelist.Count] = head;
      SortSpriteList::sortspritelist.Count = SortSpriteList::sortspritelist.Count + 1;
      head = head->next;
    } while (head != (SortNode *)0x0);
  }
  gd = this;
  qsort(SortSpriteList::sortspritelist.Array,(ulong)SortSpriteList::sortspritelist.Count,8,
        CompareSprite);
  ppSVar1 = SortSpriteList::sortspritelist.Array;
  uVar2 = (ulong)SortSpriteList::sortspritelist.Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      ppSVar1[uVar3]->next = (SortNode *)0x0;
      if (pSVar4 != (SortNode *)0x0) {
        pSVar4->equal = ppSVar1[uVar3];
      }
      pSVar4 = ppSVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return *SortSpriteList::sortspritelist.Array;
}

Assistant:

SortNode * GLDrawList::SortSpriteList(SortNode * head)
{
	SortNode * n;
	int count;
	unsigned i;

	static TArray<SortNode*> sortspritelist;

	SortNode * parent=head->parent;

	sortspritelist.Clear();
	for(count=0,n=head;n;n=n->next) sortspritelist.Push(n);
	gd=this;
	qsort(&sortspritelist[0],sortspritelist.Size(),sizeof(SortNode *),CompareSprite);
	for(i=0;i<sortspritelist.Size();i++)
	{
		sortspritelist[i]->next=NULL;
		if (parent) parent->equal=sortspritelist[i];
		parent=sortspritelist[i];
	}
	return sortspritelist[0];
}